

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *this_00;
  undefined8 extraout_RAX;
  string_view sVar2;
  EpsCopyOutputStream out;
  ulong local_70 [2];
  LogMessage local_60 [3];
  undefined8 local_30;
  undefined2 local_28;
  byte local_26;
  undefined1 local_25;
  
  iVar1 = (*this->_vptr_MessageLite[3])();
  local_70[0] = CONCAT44(extraout_var,iVar1);
  if ((local_70[0] & 0xffffffff80000000) == 0) {
    if ((long)local_70[0] <= (long)size) {
      local_26 = io::CodedOutputStream::default_serialization_deterministic_ & 1;
      local_60[0].data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        )0x0;
      local_30 = 0;
      local_28 = 0;
      local_25 = 0;
      local_60[0]._0_8_ = local_70[0] + (long)data;
      iVar1 = (*this->_vptr_MessageLite[5])(this,data);
      if (local_70[0] + (long)data == CONCAT44(extraout_var_00,iVar1)) {
        return true;
      }
      SerializePartialToArray();
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(local_60);
      _Unwind_Resume(extraout_RAX);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x270);
    sVar2 = GetTypeName(this);
    this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(local_60,sVar2);
    sVar2._M_str = " exceeded maximum protobuf size of 2GB: ";
    sVar2._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,sVar2);
    absl::lts_20250127::log_internal::LogMessage::operator<<<unsigned_long,_0>(this_00,local_70);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(local_60);
  }
  return false;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < static_cast<int64_t>(byte_size)) return false;
  uint8_t* start = reinterpret_cast<uint8_t*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}